

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  byte bVar1;
  tokens tVar2;
  anon_class_16_2_5bfe327a local_38;
  anon_class_16_2_778bcaeb local_28;
  tokens local_18;
  byte local_11;
  tokens result;
  BYTE deferredParseFlagsSave;
  
  bVar1 = this->field_0x508;
  if (0x3f < bVar1) {
    local_11 = bVar1 >> 6;
    local_28.deferredParseFlagsSave = &local_11;
    this->field_0x508 = bVar1 & 0x3f;
    local_38.result = &local_18;
    local_18 = tkEOF;
    local_38.this = this;
    local_28.this = this;
    TryFinally<Scanner<UTF8EncodingPolicyBase<false>>::ScanForcingPid()::_lambda()_1_,Scanner<UTF8EncodingPolicyBase<false>>::ScanForcingPid()::_lambda(bool)_1_>
              (&local_38,&local_28);
    return local_18;
  }
  tVar2 = ScanCore(this,true);
  return tVar2;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanForcingPid()
{
    if (m_DeferredParseFlags != ScanFlagNone)
    {
        BYTE deferredParseFlagsSave = m_DeferredParseFlags;
        m_DeferredParseFlags = ScanFlagNone;
        tokens result = tkEOF;
        TryFinally(
            [&]() /* try block */
            {
                result = this->Scan();
            },
            [&](bool) /* finally block */
            {
                this->m_DeferredParseFlags = deferredParseFlagsSave;
            });

        return result;
    }
    return Scan();
}